

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O0

void Abc_SclConeClean(SC_Man *p,Vec_Int_t *vCone)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  SC_Pair Zero;
  Vec_Int_t *vCone_local;
  SC_Man *p_local;
  
  Zero = (SC_Pair)vCone;
  memset(&pObj,0,8);
  for (local_2c = 0; iVar1 = Vec_IntSize((Vec_Int_t *)Zero), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pNtk = p->pNtk;
    iVar1 = Vec_IntEntry((Vec_Int_t *)Zero,local_2c);
    pObj_00 = Abc_NtkObj(pNtk,iVar1);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      pSVar2 = Abc_SclObjTime(p,pObj_00);
      *pSVar2 = (SC_Pair)pObj;
      pSVar2 = Abc_SclObjSlew(p,pObj_00);
      *pSVar2 = (SC_Pair)pObj;
    }
  }
  return;
}

Assistant:

static inline void Abc_SclConeClean( SC_Man * p, Vec_Int_t * vCone )
{
    SC_Pair Zero = { 0.0, 0.0 };
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vCone, p->pNtk, pObj, i )
    {
        *Abc_SclObjTime(p, pObj) = Zero;
        *Abc_SclObjSlew(p, pObj) = Zero;
    }
}